

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_plane.cpp
# Opt level: O0

bool __thiscall ON_Plane::ClosestPointTo(ON_Plane *this,ON_3dPoint p,double *s,double *t)

{
  double dVar1;
  undefined1 local_38 [8];
  ON_3dVector v;
  double *t_local;
  double *s_local;
  ON_Plane *this_local;
  
  v.z = (double)t;
  ON_3dPoint::operator-((ON_3dVector *)local_38,&p,&this->origin);
  if (s != (double *)0x0) {
    dVar1 = ON_3dVector::operator*((ON_3dVector *)local_38,&this->xaxis);
    *s = dVar1;
  }
  if (v.z != 0.0) {
    dVar1 = ON_3dVector::operator*((ON_3dVector *)local_38,&this->yaxis);
    *(double *)v.z = dVar1;
  }
  return true;
}

Assistant:

bool ON_Plane::ClosestPointTo( ON_3dPoint p, double* s, double* t ) const
{
  const ON_3dVector v = p - origin;
  if ( s )
    *s = v*xaxis;
  if ( t )
    *t = v*yaxis;
  return true;
}